

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uint ON_SubDMeshFragment::DisplayDensityFromSideSegmentCount(uint side_segment_count)

{
  uint local_14;
  uint display_density;
  uint side_segment_count_local;
  
  for (local_14 = 0; (local_14 < 6 && ((uint)(1 << ((byte)local_14 & 0x1f)) < side_segment_count));
      local_14 = local_14 + 1) {
  }
  if (1 << ((byte)local_14 & 0x1f) != side_segment_count) {
    ON_SubDIncrementErrorCount();
  }
  return local_14;
}

Assistant:

unsigned int ON_SubDMeshFragment::DisplayDensityFromSideSegmentCount(
  unsigned int side_segment_count
  )
{
  unsigned int display_density;
  for (display_density = 0; display_density < ON_SubDDisplayParameters::MaximumDensity; display_density++)
  {
    if ( 1U << display_density >= side_segment_count )
      break;
  }

  if ( 1U << display_density == side_segment_count )
    return display_density;

  return ON_SUBD_RETURN_ERROR(display_density);
}